

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O3

Operation __thiscall QMdiSubWindowPrivate::getOperation(QMdiSubWindowPrivate *this,QPoint *pos)

{
  char cVar1;
  _Base_ptr p_Var2;
  QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>
  *pQVar3;
  _Rb_tree_node_base *p_Var4;
  
  pQVar3 = (this->operationMap).d.d.ptr;
  if (pQVar3 == (QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>
                 *)0x0) {
    p_Var2 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var2 = *(_Base_ptr *)((long)&(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  while( true ) {
    p_Var4 = &(pQVar3->m)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (pQVar3 == (QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>
                   *)0x0) {
      p_Var4 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var2 == p_Var4) break;
    cVar1 = QRegion::contains((QPoint *)&p_Var2[1]._M_left);
    if (cVar1 != '\0') {
      return p_Var2[1]._M_color;
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    pQVar3 = (this->operationMap).d.d.ptr;
  }
  return _S_red;
}

Assistant:

QMdiSubWindowPrivate::Operation QMdiSubWindowPrivate::getOperation(const QPoint &pos) const
{
    OperationInfoMap::const_iterator it;
    for (it = operationMap.constBegin(); it != operationMap.constEnd(); ++it)
        if (it.value().region.contains(pos))
            return it.key();
    return None;
}